

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcopy_to_ucol.c
# Opt level: O0

int dcopy_to_ucol(int jcol,int nseg,int *segrep,int *repfnz,int *perm_r,double *dense,
                 GlobalLU_t *Glu)

{
  int_t iVar1;
  int iVar2;
  double zero;
  int_t *piStack_a8;
  int_t nzumax;
  int_t *xusub;
  int_t *usub;
  double *ucol;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t mem_error;
  int_t new_next;
  int_t nextu;
  int_t isub;
  int jsupno;
  int irow;
  int fsupc;
  int segsze;
  int kfnz;
  int k;
  int i;
  int ksupno;
  int krep;
  int ksub;
  double *dense_local;
  int *perm_r_local;
  int *repfnz_local;
  int *segrep_local;
  int local_10;
  int nseg_local;
  int jcol_local;
  
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  ucol = (double *)Glu->xlsub;
  usub = (int_t *)Glu->ucol;
  xusub = Glu->usub;
  piStack_a8 = Glu->xusub;
  zero._4_4_ = Glu->nzumax;
  nextu = lsub[jcol];
  mem_error = piStack_a8[jcol];
  segsze = nseg + -1;
  ksupno = 0;
  _krep = dense;
  dense_local = (double *)perm_r;
  perm_r_local = repfnz;
  repfnz_local = segrep;
  segrep_local._4_4_ = nseg;
  local_10 = jcol;
  do {
    if (segrep_local._4_4_ <= ksupno) {
      piStack_a8[local_10 + 1] = mem_error;
      return 0;
    }
    iVar2 = segsze + -1;
    i = repfnz_local[segsze];
    k = lsub[i];
    segsze = iVar2;
    if ((k != nextu) && (fsupc = perm_r_local[i], fsupc != -1)) {
      jsupno = supno[k];
      new_next = (*(int *)((long)ucol + (long)jsupno * 4) + fsupc) - jsupno;
      irow = (i - fsupc) + 1;
      xsup._4_4_ = mem_error + irow;
      while (zero._4_4_ < xsup._4_4_) {
        xsup._0_4_ = dLUMemXpand(local_10,mem_error,UCOL,(int_t *)((long)&zero + 4),Glu);
        if ((int_t)xsup != 0) {
          return (int_t)xsup;
        }
        usub = (int_t *)Glu->ucol;
        iVar1 = dLUMemXpand(local_10,mem_error,USUB,(int_t *)((long)&zero + 4),Glu);
        if (iVar1 != 0) {
          return iVar1;
        }
        xusub = Glu->usub;
        xlsub = Glu->lsub;
        xsup._0_4_ = 0;
      }
      for (kfnz = 0; kfnz < irow; kfnz = kfnz + 1) {
        isub = xlsub[new_next];
        xusub[mem_error] = *(int_t *)((long)dense_local + (long)isub * 4);
        *(double *)(usub + (long)mem_error * 2) = _krep[isub];
        _krep[isub] = 0.0;
        mem_error = mem_error + 1;
        new_next = new_next + 1;
      }
    }
    ksupno = ksupno + 1;
  } while( true );
}

Assistant:

int
dcopy_to_ucol(
	      int        jcol,	  /* in */
	      int        nseg,	  /* in */
	      int        *segrep,  /* in */
	      int        *repfnz,  /* in */
	      int        *perm_r,  /* in */
	      double     *dense,   /* modified - reset to zero on return */
	      GlobalLU_t *Glu      /* modified */
	      )
{
/* 
 * Gather from SPA dense[*] to global ucol[*].
 */
    int ksub, krep, ksupno;
    int i, k, kfnz, segsze;
    int fsupc, irow, jsupno;
    int_t isub, nextu, new_next, mem_error;
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    double    *ucol;
    int_t     *usub, *xusub;
    int_t       nzumax;
    double zero = 0.0;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    ucol    = (double *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    nzumax  = Glu->nzumax;
    
    jsupno = supno[jcol];
    nextu  = xusub[jcol];
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {
	krep = segrep[k--];
	ksupno = supno[krep];

	if ( ksupno != jsupno ) { /* Should go into ucol[] */
	    kfnz = repfnz[krep];
	    if ( kfnz != SLU_EMPTY ) {	/* Nonzero U-segment */

	    	fsupc = xsup[ksupno];
	        isub = xlsub[fsupc] + kfnz - fsupc;
	        segsze = krep - kfnz + 1;

		new_next = nextu + segsze;
		while ( new_next > nzumax ) {
		    mem_error = dLUMemXpand(jcol, nextu, UCOL, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    ucol = (double *) Glu->ucol;
		    mem_error = dLUMemXpand(jcol, nextu, USUB, &nzumax, Glu);
		    if (mem_error) return (mem_error);
		    usub = Glu->usub;
		    lsub = Glu->lsub;
		}
		
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    usub[nextu] = perm_r[irow];
		    ucol[nextu] = dense[irow];
		    dense[irow] = zero;
		    nextu++;
		    isub++;
		} 

	    }

	}

    } /* for each segment... */

    xusub[jcol + 1] = nextu;      /* Close U[*,jcol] */
    return 0;
}